

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cc
# Opt level: O0

void __thiscall SDL2pp::Exception::Exception(Exception *this,char *function)

{
  undefined8 uVar1;
  char *pcVar2;
  allocator local_46;
  allocator local_45 [13];
  undefined1 local_38 [40];
  char *function_local;
  Exception *this_local;
  
  local_38._32_8_ = function;
  function_local = (char *)this;
  pcVar2 = (char *)SDL_GetError();
  make_what_abi_cxx11_((Exception *)local_38,function,pcVar2);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  uVar1 = local_38._32_8_;
  *(undefined ***)this = &PTR__Exception_00119d38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->sdl_function_,(char *)uVar1,local_45);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  pcVar2 = (char *)SDL_GetError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->sdl_error_,pcVar2,&local_46);
  std::allocator<char>::~allocator((allocator<char> *)&local_46);
  return;
}

Assistant:

Exception::Exception(const char* function)
	: std::runtime_error(make_what(function, SDL_GetError())),
	  sdl_function_(function),
	  sdl_error_(SDL_GetError()) {
}